

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11JsonConfig.cpp
# Opt level: O0

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
helics::HelicsConfigJSON::fromConfigInternal
          (HelicsConfigJSON *this,json *json,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *prefix)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  reference this_00;
  undefined8 uVar4;
  json *in_RCX;
  HelicsConfigJSON *in_RDX;
  long in_RSI;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *in_RDI;
  string *in_R8;
  double dVar5;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *obj;
  const_iterator __end7;
  const_iterator __begin7;
  json *__range7;
  stringstream outstring;
  ConfigItem *res;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> sub_results;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  copy_prefix;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  *fld;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  __end2;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  __begin2;
  iteration_proxy<const_iterator> *__range2;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *results;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  *in_stack_fffffffffffffa08;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  *in_stack_fffffffffffffa10;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  *in_stack_fffffffffffffa18;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *in_stack_fffffffffffffa20;
  iterator in_stack_fffffffffffffa28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa30;
  undefined7 in_stack_fffffffffffffa38;
  undefined1 in_stack_fffffffffffffa3f;
  allocator<char> *in_stack_fffffffffffffa40;
  char *in_stack_fffffffffffffa48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
  in_stack_fffffffffffffa58;
  __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
  in_stack_fffffffffffffa60;
  const_iterator in_stack_fffffffffffffa68;
  undefined1 ****ppppuVar6;
  string *in_stack_fffffffffffffa78;
  ConversionError *in_stack_fffffffffffffa80;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffffa98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffaa8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffab0;
  undefined8 ***local_548;
  undefined8 ***local_4f8;
  undefined8 **local_3c8 [4];
  undefined1 ***local_3a8;
  undefined8 local_3a0;
  undefined1 ***local_398;
  undefined8 **local_390 [4];
  undefined1 ***local_370;
  undefined8 local_368;
  stringstream local_360 [16];
  undefined1 local_350 [382];
  undefined1 local_1d2;
  allocator<char> local_1d1;
  undefined1 ***local_1d0;
  undefined8 **local_1c8 [4];
  undefined1 ***local_1a8;
  undefined8 local_1a0;
  reference local_198;
  ConfigItem *local_190;
  ConfigItem *local_188;
  ConfigItem *local_180;
  ConfigItem *local_178;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  *local_138;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_b0;
  pointer local_40;
  pointer *local_38;
  undefined4 in_stack_ffffffffffffffd0;
  uint3 in_stack_ffffffffffffffd4;
  uint uVar7;
  
  uVar7 = (uint)in_stack_ffffffffffffffd4;
  CLI::std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::vector
            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)0x5bcb8f);
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::is_object((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_RDX);
  if (bVar1) {
    sVar3 = CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_R8);
    if (sVar3 <= *(byte *)(in_RSI + 0x27)) {
      local_40 = (pointer)nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::items((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)in_stack_fffffffffffffa08);
      local_38 = &local_40;
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::begin((iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
               *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::end((iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
      while (bVar1 = nlohmann::json_abi_v3_11_3::detail::
                     iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                     ::operator!=(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08), bVar1) {
        local_138 = nlohmann::json_abi_v3_11_3::detail::
                    iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                    ::operator*(&local_b0);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&(in_stack_fffffffffffffa60._M_current)->parents,
                 &(in_stack_fffffffffffffa58._M_current)->parents);
        bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x5bcce3);
        if ((!bVar1) &&
           (_Var2 = std::operator==(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28),
           ((_Var2 ^ 0xffU) & 1) != 0)) {
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffa20,(value_type *)in_stack_fffffffffffffa18);
        }
        nlohmann::json_abi_v3_11_3::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        ::value((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                 *)0x5bcd49);
        nlohmann::json_abi_v3_11_3::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        ::key(in_stack_fffffffffffffa18);
        fromConfigInternal(in_RDX,in_RCX,in_R8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)CONCAT44(uVar7,in_stack_ffffffffffffffd0));
        local_178 = (ConfigItem *)
                    CLI::std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::end
                              ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                               in_stack_fffffffffffffa08);
        __gnu_cxx::
        __normal_iterator<CLI::ConfigItem_const*,std::vector<CLI::ConfigItem,std::allocator<CLI::ConfigItem>>>
        ::__normal_iterator<CLI::ConfigItem*>
                  ((__normal_iterator<const_CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                    *)in_stack_fffffffffffffa10,
                   (__normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                    *)in_stack_fffffffffffffa08);
        local_180 = (ConfigItem *)
                    CLI::std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::begin
                              ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                               in_stack_fffffffffffffa08);
        local_188 = (ConfigItem *)
                    CLI::std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::end
                              ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                               in_stack_fffffffffffffa08);
        local_190 = (ConfigItem *)
                    std::vector<CLI::ConfigItem,std::allocator<CLI::ConfigItem>>::
                    insert<__gnu_cxx::__normal_iterator<CLI::ConfigItem*,std::vector<CLI::ConfigItem,std::allocator<CLI::ConfigItem>>>,void>
                              ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                               in_stack_fffffffffffffa50,in_stack_fffffffffffffa68,
                               in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        CLI::std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector
                  (in_stack_fffffffffffffa20);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffa20);
        nlohmann::json_abi_v3_11_3::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        ::operator++(in_stack_fffffffffffffa10);
      }
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::~iteration_proxy_value(in_stack_fffffffffffffa10);
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::~iteration_proxy_value(in_stack_fffffffffffffa10);
    }
  }
  else {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5bcec1);
    if (bVar1) {
      uVar4 = __cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      CLI::ConversionError::ConversionError(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      __cxa_throw(uVar4,&CLI::ConversionError::typeinfo,CLI::ConversionError::~ConversionError);
    }
    CLI::std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
              ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
               in_stack_fffffffffffffa10);
    local_198 = CLI::std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                          ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                           in_stack_fffffffffffffa10);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa10,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa08);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    bVar1 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::is_boolean((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_RDX);
    if (bVar1) {
      local_1d2 = 1;
      local_1d0 = (undefined1 ***)local_1c8;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::get<bool,bool>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_fffffffffffffa10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      local_1d2 = 0;
      local_1a8 = (undefined1 ***)local_1c8;
      local_1a0 = 1;
      __l._M_len = (size_type)in_stack_fffffffffffffa30;
      __l._M_array = in_stack_fffffffffffffa28;
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffa20,__l);
      local_4f8 = &local_1a8;
      do {
        local_4f8 = local_4f8 + -4;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa10);
      } while (local_4f8 != local_1c8);
      std::allocator<char>::~allocator(&local_1d1);
    }
    else {
      bVar1 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::is_number((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffffa10);
      if (bVar1) {
        std::__cxx11::stringstream::stringstream(local_360);
        dVar5 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::get<double,double>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffffa10);
        std::ostream::operator<<(local_350,dVar5);
        local_398 = (undefined1 ***)local_390;
        std::__cxx11::stringstream::str();
        local_370 = (undefined1 ***)local_390;
        local_368 = 1;
        __l_00._M_len = (size_type)in_stack_fffffffffffffa30;
        __l_00._M_array = in_stack_fffffffffffffa28;
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffa20,__l_00);
        ppppuVar6 = (undefined1 ****)local_390;
        local_548 = &local_370;
        do {
          local_548 = local_548 + -4;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa10);
        } while ((undefined1 ****)local_548 != ppppuVar6);
        std::__cxx11::stringstream::~stringstream(local_360);
      }
      else {
        bVar1 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::is_string((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_RDX);
        if (bVar1) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<std::__cxx11::string,std::__cxx11::string>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffffa18);
          local_3a8 = (undefined1 ***)local_3c8;
          local_3a0 = 1;
          __l_01._M_len = (size_type)in_stack_fffffffffffffa30;
          __l_01._M_array = in_stack_fffffffffffffa28;
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffa20,__l_01);
          ppppuVar6 = &local_3a8;
          do {
            ppppuVar6 = ppppuVar6 + -4;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa10);
          } while (ppppuVar6 != (undefined1 ****)local_3c8);
        }
        else {
          bVar1 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::is_array((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)in_RDX);
          if (!bVar1) {
            uVar4 = __cxa_allocate_exception(0x38);
            std::operator+((char *)in_stack_fffffffffffffa58._M_current,in_stack_fffffffffffffa50);
            CLI::ConversionError::ConversionError
                      (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
            __cxa_throw(uVar4,&CLI::ConversionError::typeinfo,CLI::ConversionError::~ConversionError
                       );
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffa08);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffa08);
          while (bVar1 = nlohmann::json_abi_v3_11_3::detail::
                         iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                         ::
                         operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                   (&in_stack_fffffffffffffa10->anchor,
                                    &in_stack_fffffffffffffa08->anchor), bVar1) {
            this_00 = nlohmann::json_abi_v3_11_3::detail::
                      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      ::operator*(in_stack_fffffffffffffa98);
            bVar1 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::is_string(this_00);
            if (!bVar1) {
              return in_RDI;
            }
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::get<std::__cxx11::string,std::__cxx11::string>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_fffffffffffffa18);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa10,(value_type *)in_stack_fffffffffffffa08);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa10);
            nlohmann::json_abi_v3_11_3::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::operator++(&in_stack_fffffffffffffa10->anchor);
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<CLI::ConfigItem>
    HelicsConfigJSON::fromConfigInternal(const nlohmann::json& json,
                                         const std::string& name,
                                         const std::vector<std::string>& prefix) const
{
    std::vector<CLI::ConfigItem> results;

    if (json.is_object()) {
        if (prefix.size() > maximumLayers) {
            return results;
        }
        for (auto& fld : json.items()) {
            auto copy_prefix = prefix;
            if (!name.empty()) {
                if (name != mPromoteSection) {
                    copy_prefix.push_back(name);
                }
            }
            auto sub_results = fromConfigInternal(fld.value(), fld.key(), copy_prefix);
            results.insert(results.end(), sub_results.begin(), sub_results.end());
        }
    } else if (!name.empty()) {
        results.emplace_back();
        CLI::ConfigItem& res = results.back();
        res.name = name;
        res.parents = prefix;
        if (json.is_boolean()) {
            res.inputs = {json.get<bool>() ? "true" : "false"};
        } else if (json.is_number()) {
            std::stringstream outstring;
            outstring << json.get<double>();
            res.inputs = {outstring.str()};
        } else if (json.is_string()) {
            res.inputs = {json.get<std::string>()};
        } else if (json.is_array()) {
            for (const auto& obj : json) {
                if (obj.is_string()) {
                    res.inputs.push_back(obj.get<std::string>());
                } else {
                    break;
                }
            }
        } else {
            throw CLI::ConversionError("Failed to convert " + name);
        }
    } else {
        throw CLI::ConversionError("You must make all top level values objects in json!");
    }

    return results;
}